

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_FindServers(UA_Server *server,UA_Session *session,UA_FindServersRequest *request,
                        UA_FindServersResponse *response)

{
  size_t sVar1;
  UA_StatusCode UVar2;
  UA_ApplicationDescription *dst;
  UA_String *pUVar3;
  uint local_90;
  uint local_88;
  uint local_84;
  UA_ServerNetworkLayer *nl;
  size_t i;
  size_t existing;
  UA_String *disc;
  UA_ApplicationDescription *descr;
  UA_FindServersResponse *response_local;
  UA_FindServersRequest *request_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_88 = 0;
  }
  else {
    if (session->channel->connection == (UA_Connection *)0x0) {
      local_84 = 0;
    }
    else {
      local_84 = session->channel->connection->sockfd;
    }
    local_88 = local_84;
  }
  if (session->channel == (UA_SecureChannel *)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = (session->channel->securityToken).channelId;
  }
  UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SESSION,
               "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Processing FindServersRequest"
               ,(ulong)local_88,(ulong)local_90,(ulong)(session->sessionId).identifier.numeric,
               (uint)(session->sessionId).identifier.guid.data2,
               (uint)(session->sessionId).identifier.guid.data3,
               (uint)(session->sessionId).identifier.guid.data4[0],
               (uint)(session->sessionId).identifier.guid.data4[1],
               (uint)(session->sessionId).identifier.guid.data4[2],
               (uint)(session->sessionId).identifier.guid.data4[3],
               (uint)(session->sessionId).identifier.guid.data4[4],
               (uint)(session->sessionId).identifier.guid.data4[5],
               (uint)(session->sessionId).identifier.guid.data4[6],
               (uint)(session->sessionId).identifier.guid.data4[7]);
  dst = (UA_ApplicationDescription *)malloc(0x78);
  if (dst == (UA_ApplicationDescription *)0x0) {
    (response->responseHeader).serviceResult = 0x80030000;
  }
  else {
    UVar2 = UA_ApplicationDescription_copy(&(server->config).applicationDescription,dst);
    (response->responseHeader).serviceResult = UVar2;
    if ((response->responseHeader).serviceResult == 0) {
      pUVar3 = (UA_String *)
               realloc(dst->discoveryUrls,
                       (dst->discoveryUrlsSize + (server->config).networkLayersSize) * 0x10);
      if (pUVar3 == (UA_String *)0x0) {
        (response->responseHeader).serviceResult = 0x80030000;
        UA_ApplicationDescription_delete(dst);
      }
      else {
        sVar1 = dst->discoveryUrlsSize;
        dst->discoveryUrls = pUVar3;
        dst->discoveryUrlsSize = (server->config).networkLayersSize + dst->discoveryUrlsSize;
        for (nl = (UA_ServerNetworkLayer *)0x0;
            nl < (UA_ServerNetworkLayer *)(server->config).networkLayersSize;
            nl = (UA_ServerNetworkLayer *)((long)&nl->handle + 1)) {
          UA_String_copy(&(server->config).networkLayers[(long)nl].discoveryUrl,
                         dst->discoveryUrls + (long)&nl->handle + sVar1);
        }
        response->servers = dst;
        response->serversSize = 1;
      }
    }
    else {
      free(dst);
    }
  }
  return;
}

Assistant:

void Service_FindServers(UA_Server *server, UA_Session *session,
                         const UA_FindServersRequest *request, UA_FindServersResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing FindServersRequest");
    /* copy ApplicationDescription from the config */
    UA_ApplicationDescription *descr = UA_malloc(sizeof(UA_ApplicationDescription));
    if(!descr) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->responseHeader.serviceResult =
        UA_ApplicationDescription_copy(&server->config.applicationDescription, descr);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_free(descr);
        return;
    }

    /* add the discoveryUrls from the networklayers */
    UA_String *disc = UA_realloc(descr->discoveryUrls, sizeof(UA_String) *
                                 (descr->discoveryUrlsSize + server->config.networkLayersSize));
    if(!disc) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_ApplicationDescription_delete(descr);
        return;
    }
    size_t existing = descr->discoveryUrlsSize;
    descr->discoveryUrls = disc;
    descr->discoveryUrlsSize += server->config.networkLayersSize;

    // TODO: Add nl only if discoveryUrl not already present
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_String_copy(&nl->discoveryUrl, &descr->discoveryUrls[existing + i]);
    }

    response->servers = descr;
    response->serversSize = 1;
}